

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::DeformableConv2D_x86_fma::destroy_pipeline(DeformableConv2D_x86_fma *this,Option *opt)

{
  Layer *pLVar1;
  
  pLVar1 = this->activation;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,opt);
    if (this->activation != (Layer *)0x0) {
      (*this->activation->_vptr_Layer[1])();
    }
    this->activation = (Layer *)0x0;
  }
  pLVar1 = this->gemm;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,opt);
    if (this->gemm != (Layer *)0x0) {
      (*this->gemm->_vptr_Layer[1])();
    }
    this->gemm = (Layer *)0x0;
  }
  return 0;
}

Assistant:

int DeformableConv2D_x86_fma::destroy_pipeline(const Option& opt)
{
    if (activation)
    {
        activation->destroy_pipeline(opt);
        delete activation;
        activation = 0;
    }

    if (gemm)
    {
        gemm->destroy_pipeline(opt);
        delete gemm;
        gemm = 0;
    }

    return 0;
}